

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

SettingsValue * __thiscall ArgsManager::GetPersistentSetting(ArgsManager *this,string *name)

{
  long lVar1;
  string *arg;
  ArgsManager *in_RDX;
  char *in_RSI;
  SettingsValue *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock13;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff88;
  AnnotatedMixin<std::recursive_mutex> *in_stack_ffffffffffffff90;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff98;
  Settings *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffdd;
  undefined1 in_stack_ffffffffffffffde;
  undefined1 in_stack_ffffffffffffffdf;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_RSI,
             (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
  arg = (string *)(in_RSI + 0x100);
  std::operator+(in_stack_ffffffffffffffa8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffffa0);
  UseDefaultSection(in_RDX,arg);
  uVar2 = 0;
  common::GetSetting(in_stack_ffffffffffffffa0,(string *)in_RDX,arg,(bool)in_stack_ffffffffffffffdf,
                     (bool)in_stack_ffffffffffffffde,(bool)in_stack_ffffffffffffffdd);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff5c,uVar2));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff5c,uVar2));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

common::SettingsValue ArgsManager::GetPersistentSetting(const std::string& name) const
{
    LOCK(cs_args);
    return common::GetSetting(m_settings, m_network, name, !UseDefaultSection("-" + name),
        /*ignore_nonpersistent=*/true, /*get_chain_type=*/false);
}